

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O2

uint32_t PatchHandleArchipelago::inject_npc_addr_to_uuid_table(ROM *rom,RandomizerWorld *world)

{
  pointer ppIVar1;
  ItemSource *this;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  pointer puVar6;
  pointer ppIVar7;
  allocator<char> local_89;
  vector<unsigned_int,_std::allocator<unsigned_int>_> npc_reward_addresses;
  ByteArray bytes;
  string local_50;
  
  npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppIVar1 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar7 = (world->_item_sources).
                 super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar2 = npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish, ppIVar7 != ppIVar1; ppIVar7 = ppIVar7 + 1)
  {
    this = *ppIVar7;
    bVar3 = ItemSource::is_npc_reward(this);
    if (bVar3) {
      uVar5 = (ulong)*(byte *)((long)&this[1]._vptr_ItemSource + 4);
      if ((ulong)((long)npc_reward_addresses.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)npc_reward_addresses.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar5) {
        local_50._M_dataplus._M_p._0_4_ = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&npc_reward_addresses,uVar5 + 1,(value_type_conflict5 *)&local_50);
      }
      npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = *(int *)&this[1]._vptr_ItemSource + 1;
    }
  }
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (puVar6 = npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    ByteArray::add_long(&bytes,*puVar6);
  }
  ByteArray::add_long(&bytes,0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_89);
  uVar4 = md::ROM::inject_bytes
                    (rom,&bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&npc_reward_addresses.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return uVar4;
}

Assistant:

static uint32_t inject_npc_addr_to_uuid_table(md::ROM& rom, RandomizerWorld& world)
    {
        std::vector<uint32_t> npc_reward_addresses;
        for(ItemSource* source : world.item_sources())
        {
            if(!source->is_npc_reward())
                continue;
            ItemSourceReward* reward_source = reinterpret_cast<ItemSourceReward*>(source);

            uint8_t reward_id = reward_source->reward_id();
            if(npc_reward_addresses.size() <= reward_id)
                npc_reward_addresses.resize(reward_id+1, 0xFFFFFFFF);
            npc_reward_addresses[reward_id] = reward_source->address_in_rom() + 1;
        }

        ByteArray bytes;
        for(uint32_t addr : npc_reward_addresses)
            bytes.add_long(addr);
        bytes.add_long(0xFFFFFFFF);
        return rom.inject_bytes(bytes);
    }